

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O0

void __thiscall TrodesMsg::processArg(TrodesMsg *this,char c,uint8_t *a)

{
  int iVar1;
  string *this_00;
  char *__nptr;
  undefined1 *in_RDX;
  char in_SIL;
  long in_RDI;
  char *str;
  undefined1 local_5c;
  allocator local_19;
  undefined1 *local_18;
  
  if (in_SIL != '1') {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (this_00,"Could not read message. Expected different type, got uint8_t",&local_19);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  local_18 = in_RDX;
  __nptr = zmsg_popstr(*(zmsg_t **)(in_RDI + 0x20));
  if (__nptr == (char *)0x0) {
    local_5c = 0;
  }
  else {
    iVar1 = atoi(__nptr);
    local_5c = (undefined1)iVar1;
  }
  *local_18 = local_5c;
  free(__nptr);
  return;
}

Assistant:

void TrodesMsg::processArg(const char c, uint8_t &a){
    if(c != '1') throw std::string(PROCESSERROR "uint8_t");
    char *str = zmsg_popstr(msg);
    a = str ? (uint8_t)atoi(str) : 0;
    freen(str);
}